

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O2

void __thiscall slang::ast::EvalContext::reset(EvalContext *this)

{
  *(undefined8 *)&this->steps = 0;
  *(undefined8 *)((long)&this->disableTarget + 4) = 0;
  *(undefined4 *)((long)&this->queueTarget + 4) = 0;
  SmallVectorBase<slang::ast::EvalContext::Frame>::clear
            (&(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>);
  (this->lvalStack).super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  SmallVectorBase<slang::Diagnostic>::clear((SmallVectorBase<slang::Diagnostic> *)&this->diags);
  SmallVectorBase<slang::Diagnostic>::clear((SmallVectorBase<slang::Diagnostic> *)&this->warnings);
  (this->disableRange).startLoc = (SourceLocation)0x0;
  (this->disableRange).endLoc = (SourceLocation)0x0;
  this->backtraceReported = false;
  return;
}

Assistant:

void EvalContext::reset() {
    steps = 0;
    disableTarget = nullptr;
    queueTarget = nullptr;
    stack.clear();
    lvalStack.clear();
    diags.clear();
    warnings.clear();
    disableRange = {};
    backtraceReported = false;
}